

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O1

void __thiscall
duckdb::PartitionGlobalMergeStates::PartitionGlobalMergeStates
          (PartitionGlobalMergeStates *this,PartitionGlobalSinkState *sink)

{
  _Head_base<0UL,_duckdb::TupleDataCollection_*,_false> _Var1;
  pointer this_00;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar2;
  pointer this_01;
  idx_t *piVar3;
  PartitionGlobalMergeState *pPVar4;
  long lVar5;
  pointer *__ptr;
  hash_t hash_bin;
  pointer puVar6;
  templated_unique_single_t state_1;
  templated_unique_single_t state;
  _Head_base<0UL,_duckdb::TupleDataCollection_*,_false> local_48;
  _Head_base<0UL,_duckdb::PartitionGlobalMergeState_*,_false> local_40;
  vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>,std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>>
  *local_38;
  
  (this->states).
  super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states).
  super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states).
  super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = (vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>,std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>>
              *)this;
  if ((sink->grouping_data).
      super_unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RadixPartitionedTupleData_*,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
      .super__Head_base<0UL,_duckdb::RadixPartitionedTupleData_*,_false>._M_head_impl ==
      (RadixPartitionedTupleData *)0x0) {
    local_48._M_head_impl = (TupleDataCollection *)0x1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sink->bin_groups,1,
               (value_type_conflict2 *)&local_48);
    pPVar4 = (PartitionGlobalMergeState *)operator_new(0x2b8);
    PartitionGlobalMergeState::PartitionGlobalMergeState(pPVar4,sink);
    local_48._M_head_impl = (TupleDataCollection *)pPVar4;
    ::std::
    vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>,std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>
              (local_38,(unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>
                         *)&local_48);
    if ((PartitionGlobalMergeState *)local_48._M_head_impl != (PartitionGlobalMergeState *)0x0) {
      ::std::default_delete<duckdb::PartitionGlobalMergeState>::operator()
                ((default_delete<duckdb::PartitionGlobalMergeState> *)&local_48,
                 (PartitionGlobalMergeState *)local_48._M_head_impl);
    }
  }
  else {
    this_00 = unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>,_true>
              ::operator->(&sink->grouping_data);
    puVar2 = PartitionedTupleData::GetPartitions(&this_00->super_PartitionedTupleData);
    local_48._M_head_impl =
         (TupleDataCollection *)
         ((long)(puVar2->
                super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(puVar2->
                super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sink->bin_groups,
               (size_type)local_48._M_head_impl,(value_type_conflict2 *)&local_48);
    puVar6 = (puVar2->
             super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((puVar2->
        super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar6) {
      lVar5 = 0;
      hash_bin = 0;
      do {
        this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                  ::operator->((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                                *)((long)&(puVar6->
                                          super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                          )._M_t.
                                          super___uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::TupleDataCollection_*,_std::default_delete<duckdb::TupleDataCollection>_>
                                          .
                                          super__Head_base<0UL,_duckdb::TupleDataCollection_*,_false>
                                          ._M_head_impl + lVar5));
        piVar3 = TupleDataCollection::Count(this_01);
        if (*piVar3 != 0) {
          pPVar4 = (PartitionGlobalMergeState *)operator_new(0x2b8);
          local_48._M_head_impl =
               puVar6[hash_bin].
               super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::TupleDataCollection_*,_std::default_delete<duckdb::TupleDataCollection>_>
               .super__Head_base<0UL,_duckdb::TupleDataCollection_*,_false>._M_head_impl;
          puVar6[hash_bin].
          super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::TupleDataCollection_*,_std::default_delete<duckdb::TupleDataCollection>_>
          .super__Head_base<0UL,_duckdb::TupleDataCollection_*,_false>._M_head_impl =
               (TupleDataCollection *)0x0;
          PartitionGlobalMergeState::PartitionGlobalMergeState
                    (pPVar4,sink,(GroupDataPtr *)&local_48,hash_bin);
          _Var1._M_head_impl = local_48._M_head_impl;
          local_40._M_head_impl = pPVar4;
          if ((PartitionGlobalMergeState *)local_48._M_head_impl != (PartitionGlobalMergeState *)0x0
             ) {
            TupleDataCollection::~TupleDataCollection(local_48._M_head_impl);
            operator_delete(_Var1._M_head_impl);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>,std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>
                    (local_38,(unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>
                               *)&local_40);
          if (local_40._M_head_impl != (PartitionGlobalMergeState *)0x0) {
            ::std::default_delete<duckdb::PartitionGlobalMergeState>::operator()
                      ((default_delete<duckdb::PartitionGlobalMergeState> *)&local_40,
                       local_40._M_head_impl);
          }
        }
        hash_bin = hash_bin + 1;
        puVar6 = (puVar2->
                 super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 8;
      } while (hash_bin <
               (ulong)((long)(puVar2->
                             super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3));
    }
  }
  (*sink->_vptr_PartitionGlobalSinkState[2])(sink);
  return;
}

Assistant:

PartitionGlobalMergeStates::PartitionGlobalMergeStates(PartitionGlobalSinkState &sink) {
	// Schedule all the sorts for maximum thread utilisation
	if (sink.grouping_data) {
		auto &partitions = sink.grouping_data->GetPartitions();
		sink.bin_groups.resize(partitions.size(), partitions.size());
		for (hash_t hash_bin = 0; hash_bin < partitions.size(); ++hash_bin) {
			auto &group_data = partitions[hash_bin];
			// Prepare for merge sort phase
			if (group_data->Count()) {
				auto state = make_uniq<PartitionGlobalMergeState>(sink, std::move(group_data), hash_bin);
				states.emplace_back(std::move(state));
			}
		}
	} else {
		//	OVER(ORDER BY...)
		//	Already sunk into the single global sort, so set up single merge with no data
		sink.bin_groups.resize(1, 1);
		auto state = make_uniq<PartitionGlobalMergeState>(sink);
		states.emplace_back(std::move(state));
	}

	sink.OnBeginMerge();
}